

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::CalculateG2
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,
          int verbosity)

{
  VDetector *pVVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  value_type *__val;
  pointer pdVar11;
  ostream *poVar12;
  RandomGen *pRVar13;
  int64_t iVar14;
  int64_t iVar15;
  runtime_error *this_00;
  int iVar16;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  bool YesGas;
  double local_100;
  double local_f0;
  double local_e8;
  bool local_c9;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  double local_a0;
  double local_98;
  double local_90;
  vector<double,_std::allocator<double>_> *local_88;
  double local_80;
  void *local_78 [2];
  long local_68;
  void *local_60 [2];
  long local_50;
  void *local_48 [2];
  long local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar11 = (pointer)operator_new(0x28);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar11;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar11;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar11 + 5;
  *pdVar11 = 0.0;
  pdVar11[1] = 0.0;
  pdVar11[2] = 0.0;
  pdVar11[3] = 0.0;
  pdVar11[4] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar11 + 5;
  if (this->fdetector->inGas == false) {
    uVar17 = 0x71f8909d;
    uVar18 = 0x3ffd9010;
  }
  else {
    uVar17 = 0;
    uVar18 = 0x3ff00000;
  }
  local_b8._8_8_ = 0;
  local_b8._0_8_ = this->fdetector->E_gas;
  local_88 = __return_storage_ptr__;
  bVar10 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  uVar19 = local_b8._12_4_;
  dVar3 = local_b8._0_8_ / (double)CONCAT44(uVar18,uVar17);
  local_b8._8_4_ = local_b8._8_4_;
  local_b8._0_8_ = dVar3;
  local_b8._12_4_ = uVar19;
  if (bVar10) {
    dVar3 = pow(dVar3,1.3849);
    dVar3 = exp(dVar3 * -1.003);
    dVar3 = dVar3 * -1.1974 + 1.0;
  }
  else {
    dVar3 = this->fdetector->T_Kelvin;
    dVar20 = dVar3 * dVar3;
    dVar22 = pow(dVar3,3.0);
    dVar21 = pow(dVar3,4.0);
    dVar8 = pow(dVar3,3.0);
    dVar9 = pow(dVar3,4.0);
    dVar4 = pow(dVar3,5.0);
    dVar5 = pow(dVar3,3.0);
    dVar6 = pow(dVar3,4.0);
    dVar7 = pow(dVar3,5.0);
    local_e8 = -(dVar4 * -3.194249083426e-06 +
                dVar9 * 0.002778229721617 +
                dVar8 * -0.9663183204468 +
                dVar20 * 168.0089978382 + dVar3 * -14601.68019275 + 507480.0229635);
    dVar8 = pow((double)local_b8._0_8_,
                dVar20 * -1602.830617076 + dVar3 * 136655.5237249 + -4659269.96412 +
                dVar5 * 9.397480411915 + dVar6 * -0.02754232523872 + dVar7 * 3.228101180588e-05);
    dVar8 = exp(dVar8 * local_e8);
    dVar3 = 1.0 - dVar8 * (dVar21 * 9.607626262594e-05 +
                          dVar22 * -0.06692362929271 +
                          dVar20 * 17.47197309338 + dVar3 * -2026.247730928 + 88075.2862664);
  }
  if ((1.0 < dVar3) || (this->fdetector->inGas == true)) {
    dVar3 = 1.0;
  }
  pVVar1 = this->fdetector;
  local_98 = pVVar1->anode - pVVar1->TopDrift;
  if ((0.0 < (double)local_b8._0_8_) && (local_98 <= 0.0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"\tERR: The gas gap in the S2 calculation broke!!!!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_c9 = true;
  dVar22 = GetDensity(pVVar1->T_Kelvin,pVVar1->p_bar,&local_c9,1,pVVar1->molarMass);
  bVar10 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar10) {
    uVar17 = 0x87548d16;
    uVar18 = 0x3c41863f;
  }
  else {
    uVar17 = 0xd68a42b6;
    uVar18 = 0x3c55acc7;
  }
  dVar21 = (double)CONCAT44(uVar18,uVar17);
  if (bVar10) {
    local_c0 = 0.0813;
  }
  else {
    local_c0 = 0.137;
  }
  dVar8 = (this->fdetector->E_gas * local_c0 * 1000.0 +
          ((dVar22 * -6.0221409e+23) / this->fdetector->molarMass) * dVar21) * local_98 * 0.1;
  if ((((double)local_b8._0_8_ != 0.0) || (NAN((double)local_b8._0_8_))) && (dVar8 <= 0.0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\tWARNING, the field in gas must be at least ",0x2c);
    poVar12 = std::ostream::_M_insert<double>
                        ((dVar22 * dVar21 * 0.001 * 6.0221409e+23) /
                         (this->fdetector->molarMass * local_c0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," kV/cm, for S2 to work,",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\tOR: your density for gas must be less than ",0x2c);
    poVar12 = std::ostream::_M_insert<double>
                        ((local_c0 * this->fdetector->molarMass * this->fdetector->E_gas * 1000.0) /
                         (dVar21 * 6.0221409e+23));
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," g/cm^3.",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  pVVar1 = this->fdetector;
  local_a0 = pVVar1->g1_gas * dVar8;
  if (pVVar1->s2_thr <= 0.0 && pVVar1->s2_thr != 0.0) {
    (*pVVar1->_vptr_VDetector[7])(0,0,pVVar1->TopDrift * 0.5,local_78);
    local_a0 = local_a0 * *(double *)((long)local_78[0] + 8);
    if (local_78[0] != (void *)0x0) {
      operator_delete(local_78[0],local_68 - (long)local_78[0]);
    }
  }
  uVar17 = 0;
  uVar18 = 0;
  if (0.0 <= dVar3) {
    uVar17 = SUB84(dVar3,0);
    uVar18 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  local_b8._0_8_ = ~-(ulong)((double)local_b8._0_8_ <= 0.0) & CONCAT44(uVar18,uVar17);
  local_b8._8_8_ = 0;
  local_80 = (double)local_b8._0_8_ * local_a0;
  if (verbosity < 1) {
    local_f0 = local_a0;
  }
  else {
    iVar16 = 10000;
    local_f0 = 0.0;
    local_c0 = 0.0;
    do {
      pRVar13 = RandomGen::rndm();
      dVar3 = this->fdetector->s2Fano * dVar8;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = RandomGen::rand_gauss(pRVar13,dVar8,dVar3,true);
      local_c8 = floor(dVar3 + 0.5);
      pRVar13 = RandomGen::rndm();
      dVar22 = RandomGen::rand_uniform(pRVar13);
      dVar3 = this->fdetector->radius;
      pRVar13 = RandomGen::rndm();
      dVar21 = RandomGen::rand_uniform(pRVar13);
      if (dVar21 < 0.0) {
        dVar21 = sqrt(dVar21);
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      dVar3 = dVar3 * dVar21;
      local_90 = cos(dVar22 * 6.283185307179586);
      local_90 = local_90 * dVar3;
      dVar22 = sin(dVar22 * 6.283185307179586);
      (*this->fdetector->_vptr_VDetector[6])
                (SUB84(local_90,0),SUB84(dVar3 * dVar22,0),this->fdetector,0);
      (*this->fdetector->_vptr_VDetector[6])(0,0,this->fdetector,0);
      pRVar13 = RandomGen::rndm();
      dVar22 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) /
               (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      iVar14 = RandomGen::binom_draw(pRVar13,(long)(int)local_c8,this->fdetector->g1_gas * dVar22);
      pRVar13 = RandomGen::rndm();
      iVar15 = RandomGen::binom_draw(pRVar13,(long)(int)iVar14,this->fdetector->P_dphe);
      pRVar13 = RandomGen::rndm();
      dVar21 = (double)(iVar15 + (int)iVar14);
      dVar3 = this->fdetector->sPEres;
      uVar17 = SUB84(dVar3,0);
      uVar18 = (undefined4)((ulong)dVar3 >> 0x20);
      if (dVar21 < 0.0) {
        local_c8 = dVar3;
        dVar3 = sqrt(dVar21);
        uVar17 = SUB84(local_c8,0);
        uVar18 = (undefined4)((ulong)local_c8 >> 0x20);
      }
      else {
        dVar3 = SQRT(dVar21);
      }
      dVar21 = RandomGen::rand_gauss(pRVar13,dVar21,(double)CONCAT44(uVar18,uVar17) * dVar3,true);
      dVar3 = this->fdetector->noiseQuadratic[1];
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        pRVar13 = RandomGen::rndm();
        dVar9 = dVar21 * dVar21 * this->fdetector->noiseQuadratic[1];
        dVar3 = this->fdetector->noiseLinear[1] * dVar21;
        dVar3 = dVar3 * dVar3 + dVar9 * dVar9;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
      }
      else {
        pRVar13 = RandomGen::rndm();
        dVar3 = this->fdetector->noiseLinear[1] * dVar21;
      }
      local_100 = RandomGen::rand_gauss(pRVar13,dVar21,dVar3,true);
      pdVar2 = &this->fdetector->s2_thr;
      if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
        pRVar13 = RandomGen::rndm();
        (*this->fdetector->_vptr_VDetector[7])(0,0,this->fdetector->TopDrift * 0.5,local_78);
        local_c8 = *(double *)((long)local_78[0] + 8) * local_100;
        (*this->fdetector->_vptr_VDetector[7])(0,0,this->fdetector->TopDrift * 0.5,local_48);
        local_90 = *(double *)((long)local_48[0] + 8);
        (*this->fdetector->_vptr_VDetector[7])(0,0,this->fdetector->TopDrift * 0.5,local_60);
        dVar3 = (1.0 - *(double *)((long)local_60[0] + 8)) * local_100 * local_90;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        local_100 = RandomGen::rand_gauss(pRVar13,local_c8,dVar3,true);
        if (local_60[0] != (void *)0x0) {
          operator_delete(local_60[0],local_50 - (long)local_60[0]);
        }
        if (local_48[0] != (void *)0x0) {
          operator_delete(local_48[0],local_38 - (long)local_48[0]);
        }
        if (local_78[0] != (void *)0x0) {
          operator_delete(local_78[0],local_68 - (long)local_78[0]);
        }
      }
      dVar22 = (local_100 / dVar22) / (this->fdetector->P_dphe + 1.0);
      dVar3 = local_a0 - dVar22;
      local_c0 = local_c0 + dVar3 * dVar3;
      local_f0 = local_f0 + dVar22;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    if (local_c0 < 0.0) {
      dVar3 = sqrt(local_c0);
    }
    else {
      dVar3 = SQRT(local_c0);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"g1 = ",5);
    poVar12 = std::ostream::_M_insert<double>(this->fdetector->g1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," phd per photon\tg2 = ",0x15);
    poVar12 = std::ostream::_M_insert<double>(local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," phd per electron (e-EE = ",0x1a);
    poVar12 = std::ostream::_M_insert<double>((double)local_b8._0_8_ * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"%, SE_mean,width = ",0x13);
    local_f0 = local_f0 / 10000.0;
    poVar12 = std::ostream::_M_insert<double>(local_f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
    poVar12 = std::ostream::_M_insert<double>(dVar3 / 99.99499987499375);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,")\t",2);
  }
  pdVar2 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = dVar8;
  pdVar2[1] = (double)local_b8._0_8_;
  pdVar2[2] = local_f0;
  pdVar2[3] = local_80;
  pdVar2[4] = local_98;
  return local_88;
}

Assistant:

vector<double> NESTcalc::CalculateG2(int verbosity) {
  vector<double> g2_params(5);

  // Set parameters for calculating EL yield and extraction
  double alpha = 0.137, beta = 4.70e-18,
         gamma = 0;  // note the value of alpha is similar to ~1/7eV. Not
                     // coincidence. Noted in Mock et al.
  // actually listed as 'a' and 'b' in ref (below). Units 1/V, cm^2
  double epsilonRatio = EPS_LIQ / std::abs(EPS_GAS);
  if (fdetector->get_inGas())
    epsilonRatio = 1.;  // in an all-gas detector, E_liq variable below simply
  // becomes the field value between anode and gate

  // Convert gas extraction field to liquid field
  double E_liq = fdetector->get_E_gas() / epsilonRatio;  // kV per cm
  double ExtEff;
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))  // Argon
    ExtEff =
        1. - 1.1974 * exp(-1.003 *
                          pow(E_liq, 1.3849));  // Guschin 1978-79 and 1981-82
  else {
    if (EPS_GAS < 0.) {
      ExtEff =
          1. -
          exp(-0.12172 *
              pow(E_liq, 2.0691));  // Columbia and PandaX: much higher than
                                    // everyone else, so tucked away as optional
    } else {
      double T_Kelvin =
          fdetector->get_T_Kelvin();  // data was available at 160(solid), 165,
                                      // 170, 173, 175, 177, 179, 181 K (can't
                                      // find PandaX)
      double em1 = 8.807528626640e4 - 2.026247730928e3 * T_Kelvin +
                   1.747197309338e1 * pow(T_Kelvin, 2.) -
                   6.692362929271e-2 * pow(T_Kelvin, 3.) +
                   9.607626262594e-5 * pow(T_Kelvin, 4.);  // ~1
      double em2 = 5.074800229635e5 -                      // ~0.05
                   1.460168019275e4 * T_Kelvin +
                   1.680089978382e2 * pow(T_Kelvin, 2.) -
                   9.663183204468e-1 * pow(T_Kelvin, 3.) +
                   2.778229721617e-3 * pow(T_Kelvin, 4.) -
                   3.194249083426e-6 * pow(T_Kelvin, 5.);
      double em3 = -4.659269964120e6 +  // ~1-5
                   1.366555237249e5 * T_Kelvin -
                   1.602830617076e3 * pow(T_Kelvin, 2.) +
                   9.397480411915e-0 * pow(T_Kelvin, 3.) -
                   2.754232523872e-2 * pow(T_Kelvin, 4.) +
                   3.228101180588e-5 * pow(T_Kelvin, 5.);
      ExtEff =
          1. -
          em1 * exp(-em2 *
                    pow(E_liq,
                        em3));  // combination of GusX4 (RED fav), PIXeY,
                                // LUX Run03, LLNLx2, LUX Run04, XENON10,100
    }
  }
  if (ExtEff > 1. || fdetector->get_inGas()) ExtEff = 1.;
  if (ExtEff < 0. || E_liq <= 0.) ExtEff = 0.;

  double gasGap =
      fdetector->get_anode() -
      fdetector
          ->get_TopDrift();  // EL gap in mm -> cm, affecting S2 size linearly
  if (gasGap <= 0. && E_liq > 0.) {
    throw std::runtime_error(
        "\tERR: The gas gap in the S2 calculation broke!!!!");
  }

  // Calculate EL yield based on gas gap, extraction field, and pressure
  // double elYield = (alpha * fdetector->get_E_gas() * 1e3 -
  //                beta * fdetector->get_p_bar() - gamma) *
  //               gasGap * 0.1;  // arXiv:1207.2292 (HA, Vitaly C.)
  bool YesGas = true;
  double rho = GetDensity(fdetector->get_T_Kelvin(), fdetector->get_p_bar(),
                          YesGas, 1, fdetector->get_molarMass());
  double elYield;
  if (ValidityTests::nearlyEqual(
          ATOM_NUM, 18.)) {  // Henrique Araujo and Vitaly Chepel again
    alpha = 0.0813;
    beta = 1.90e-18;
  }
  elYield = (alpha * fdetector->get_E_gas() * 1e3 -
             beta * (NEST_AVO * rho / fdetector->get_molarMass())) *
            gasGap * 0.1;
  // replaced with more accurate version also from 1207.2292, but works for room
  // temperature gas
  if (elYield <= 0.0 && E_liq != 0.) {
    cerr << "\tWARNING, the field in gas must be at least "
         << 1e-3 * beta * NEST_AVO * rho / (alpha * fdetector->get_molarMass())
         << " kV/cm, for S2 to work," << endl;
    cerr << "\tOR: your density for gas must be less than "
         << fdetector->get_molarMass() * alpha * fdetector->get_E_gas() * 1e3 /
                (beta * NEST_AVO)
         << " g/cm^3." << endl;
  }
  // Calculate single electron size and then g2
  double SE = elYield * fdetector->get_g1_gas();  // multiplying by light
  // collection efficiency in
  // the gas gap
  if (fdetector->get_s2_thr() < 0)
    SE *= fdetector->FitTBA(0., 0., fdetector->get_TopDrift() / 2.)[1];
  double g2 = ExtEff * SE;
  double StdDev = 0., Nphe, pulseArea, pulseAreaC, NphdC, phi, posDep, r, x, y;
  int Nph, nHits, numSE = 10000;
  if (verbosity > 0) {
    double muSE = 0.;
    for (int i = 0; i < numSE; ++i) {
      // calculate properly the width (1-sigma std dev) in the SE size
      Nph = int(
          floor(RandomGen::rndm()->rand_gauss(
                    elYield, sqrt(fdetector->get_s2Fano() * elYield), true) +
                0.5));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      r = fdetector->get_radius() * sqrt(RandomGen::rndm()->rand_uniform());
      x = r * cos(phi);
      y = r * sin(phi);
      posDep = fdetector->FitS2(x, y, VDetector::fold) /
               fdetector->FitS2(
                   0., 0., VDetector::fold);  // future upgrade: smeared pos
      nHits =
          RandomGen::rndm()->binom_draw(Nph, fdetector->get_g1_gas() * posDep);
      Nphe =
          nHits + RandomGen::rndm()->binom_draw(nHits, fdetector->get_P_dphe());
      pulseArea = RandomGen::rndm()->rand_gauss(
          Nphe, fdetector->get_sPEres() * sqrt(Nphe), true);
      if (fdetector->get_noiseQuadratic()[1] != 0) {
        pulseArea = RandomGen::rndm()->rand_gauss(
            pulseArea,
            sqrt(
                pow(fdetector->get_noiseQuadratic()[1] * pow(pulseArea, 2), 2) +
                pow(fdetector->get_noiseLinear()[1] * pulseArea, 2)),
            true);
      } else {
        pulseArea = RandomGen::rndm()->rand_gauss(
            pulseArea, fdetector->get_noiseLinear()[1] * pulseArea, true);
      }
      if (fdetector->get_s2_thr() < 0.)
        pulseArea = RandomGen::rndm()->rand_gauss(
            fdetector->FitTBA(0.0, 0.0, fdetector->get_TopDrift() / 2.)[1] *
                pulseArea,
            sqrt(
                fdetector->FitTBA(0.0, 0.0, fdetector->get_TopDrift() / 2.)[1] *
                pulseArea *
                (1. - fdetector->FitTBA(0.0, 0.0,
                                        fdetector->get_TopDrift() / 2.)[1])),
            true);
      pulseAreaC = pulseArea / posDep;
      NphdC = pulseAreaC / (1. + fdetector->get_P_dphe());
      StdDev += (SE - NphdC) * (SE - NphdC);
      muSE += NphdC;
    }
    SE = muSE / double(numSE);
    StdDev =
        sqrt(StdDev) / sqrt(double(numSE) - 1.);  // N-1 from above (10,000)

    cout << endl
         << "g1 = " << fdetector->get_g1() << " phd per photon\tg2 = " << g2
         << " phd per electron (e-EE = ";
    cout << ExtEff * 100. << "%, SE_mean,width = " << SE << "," << StdDev
         << ")\t";
  }

  // Store the g2 parameters in a vector for later (calculated once per
  // detector)
  g2_params[0] = elYield;
  g2_params[1] = ExtEff;
  g2_params[2] = SE;
  g2_params[3] = g2;
  g2_params[4] = gasGap;
  return g2_params;
}